

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O3

bool __thiscall EventLoop::updateSocket(EventLoop *this,int fd,uint mode)

{
  _Rb_tree_header *p_Var1;
  uint __errnum;
  FILE *__stream;
  int iVar2;
  _Base_ptr p_Var3;
  uint *puVar4;
  _Base_ptr p_Var5;
  bool bVar6;
  undefined1 local_5c [12];
  undefined1 *local_50;
  undefined1 local_40 [16];
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  p_Var5 = (this->mSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    p_Var1 = &(this->mSockets)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (fd <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < fd];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= fd)) {
      *(uint *)&p_Var3[1]._M_parent = mode;
      local_5c._8_4_ = 0;
      local_5c._0_4_ =
           (mode & 1 | (mode & 0xfffffff0) << 0x1b) + (mode & 2) * 2 + (mode & 4) * 0x10000000 +
           0x80002000;
      local_5c._4_4_ = fd;
      iVar2 = epoll_ctl(this->mPollFd,3,fd,(epoll_event *)local_5c);
      bVar6 = true;
      if (iVar2 == -1) {
        puVar4 = (uint *)__errno_location();
        __stream = _stderr;
        __errnum = *puVar4;
        if ((__errnum != 2) && (__errnum != 0x11)) {
          Rct::strerror((Rct *)&local_50,__errnum);
          fprintf(__stream,"Unable to register socket %d with mode %x: %d (%s)\n",fd,(ulong)mode,
                  (ulong)__errnum,local_50);
          if (local_50 != local_40) {
            operator_delete(local_50);
          }
          bVar6 = false;
        }
      }
      goto LAB_0014758c;
    }
  }
  bVar6 = false;
  fprintf(_stderr,"Unable to find socket to update %d\n",fd);
LAB_0014758c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return bVar6;
}

Assistant:

bool EventLoop::updateSocket(int fd, unsigned int mode)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end()) {
        fprintf(stderr, "Unable to find socket to update %d\n", fd);
        return false;
    }
#if defined(HAVE_KQUEUE)
    const int oldMode = socket->second.first;
#endif
    socket->second.first = mode;

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.events = EPOLLRDHUP;
    if (!(mode & SocketLevelTriggered))
        ev.events |= EPOLLET;
    if (mode & SocketRead)
        ev.events |= EPOLLIN;
    if (mode & SocketWrite)
        ev.events |= EPOLLOUT;
    if (mode & SocketOneShot)
        ev.events |= EPOLLONESHOT;
    ev.data.fd = fd;
    e = epoll_ctl(mPollFd, EPOLL_CTL_MOD, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf) && !(oldMode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        if (mode & flags[i].rf) {
            ev.flags = EV_ADD|EV_ENABLE;
            if (mode & SocketOneShot)
                ev.flags |= EV_ONESHOT;
        } else {
            assert(oldMode & flags[i].rf);
            ev.flags = EV_DELETE|EV_DISABLE;
        }
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != EEXIST && errno != ENOENT) {
            fprintf(stderr, "Unable to register socket %d with mode %x: %d (%s)\n",
                    fd, mode, errno, Rct::strerror().constData());
            return false;
        }
    }
    return true;
}